

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void read_from_buffer(DESCRIPTOR_DATA *d)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  char *__src;
  ulong uVar7;
  char *pcVar8;
  
  if (d->incomm[0] != '\0') {
    return;
  }
  pcVar5 = d->incomm;
  pcVar8 = d->inbuf;
  pcVar3 = pcVar8;
  while( true ) {
    cVar1 = *pcVar3;
    if (cVar1 == '\0') {
      return;
    }
    if ((cVar1 == '\r') || (cVar1 == '\n')) break;
    pcVar3 = pcVar3 + 1;
  }
  uVar7 = 0;
  iVar6 = 0;
  while( true ) {
    cVar1 = pcVar8[uVar7];
    if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0027a135;
    if (0x11fd < iVar6) break;
    if (iVar6 < 1 || cVar1 != '\b') {
      if ((-1 < cVar1) && (iVar2 = isprint((int)cVar1), iVar2 != 0)) {
        lVar4 = (long)iVar6;
        iVar6 = iVar6 + 1;
        pcVar5[lVar4] = cVar1;
      }
    }
    else {
      iVar6 = iVar6 + -1;
    }
    uVar7 = uVar7 + 1;
  }
  write_to_descriptor((int)d->descriptor,"Line too long.\n\r",0);
  while ((0xd < (byte)pcVar8[uVar7] || ((0x2401U >> ((byte)pcVar8[uVar7] & 0x1f) & 1) == 0))) {
    uVar7 = uVar7 + 1;
  }
  pcVar8[uVar7] = '\n';
  pcVar8[(int)uVar7 + 1] = '\0';
LAB_0027a135:
  if (iVar6 == 0) {
    *pcVar5 = ' ';
    iVar6 = 1;
  }
  d->incomm[iVar6] = '\0';
  pcVar3 = d->inlast;
  __src = pcVar5;
  if (d->incomm[0] == '!') {
    __src = pcVar3;
    pcVar3 = pcVar5;
  }
  strcpy(pcVar3,__src);
  pcVar5 = d->inbuf + (uVar7 & 0xffffffff);
  while( true ) {
    if ((*pcVar5 != '\n') && (*pcVar5 != '\r')) break;
    uVar7 = (ulong)((int)uVar7 + 1);
    pcVar5 = pcVar5 + 1;
  }
  do {
    cVar1 = pcVar8[(int)uVar7];
    *pcVar8 = cVar1;
    pcVar8 = pcVar8 + 1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void read_from_buffer(DESCRIPTOR_DATA *d)
{
	int i, j, k;

	/*
	 * Hold horses if pending command already.
	 */
	if (d->incomm[0] != '\0')
		return;

	/*
	 * Look for at least one new line.
	 */
	for (i = 0; d->inbuf[i] != '\n' && d->inbuf[i] != '\r'; i++)
	{
		if (d->inbuf[i] == '\0')
			return;
	}

	/*
	 * Canonical input processing.
	 */
	for (i = 0, k = 0; d->inbuf[i] != '\n' && d->inbuf[i] != '\r'; i++)
	{
		if (k >= MAX_INPUT_LENGTH - 2)
		{
			write_to_descriptor(d->descriptor, "Line too long.\n\r", 0);

			/* skip the rest of the line */
			for (; d->inbuf[i] != '\0'; i++)
			{
				if (d->inbuf[i] == '\n' || d->inbuf[i] == '\r')
					break;
			}

			d->inbuf[i] = '\n';
			d->inbuf[i + 1] = '\0';
			break;
		}

		if (d->inbuf[i] == '\b' && k > 0)
			--k;
		else if (isascii(d->inbuf[i]) && isprint(d->inbuf[i]))
			d->incomm[k++] = d->inbuf[i];
	}

	/*
	 * Finish off the line.
	 */
	if (k == 0)
		d->incomm[k++] = ' ';

	d->incomm[k] = '\0';

	/*
	 * Do '!' substitution.
	 */
	if (d->incomm[0] == '!')
		strcpy(d->incomm, d->inlast);
	else
		strcpy(d->inlast, d->incomm);

	/*
	 * Shift the input buffer.
	 */
	while (d->inbuf[i] == '\n' || d->inbuf[i] == '\r')
		i++;
	for (j = 0; (d->inbuf[j] = d->inbuf[i + j]) != '\0'; j++)
		;
	return;
}